

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::repaint<QRect>(QWidgetPrivate *this,QRect r)

{
  QWidget *this_00;
  long lVar1;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  QRect local_20;
  long local_10;
  
  local_20._8_8_ = r._8_8_;
  local_20._0_8_ = r._0_8_;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if ((((this_00->data->widget_attributes & 0x8400) == 0x8000) && (r.x1.m_i.m_i <= r.x2.m_i.m_i)) &&
     (r.y1.m_i.m_i <= r.y2.m_i.m_i)) {
    pQVar2 = QWidget::window(this_00);
    lVar1 = *(long *)(*(long *)&pQVar2->field_0x8 + 0x78);
    if (((lVar1 != 0) && (lVar1 = *(long *)(lVar1 + 8), lVar1 != 0)) &&
       ((*(long *)(lVar1 + 0x10) != 0 &&
        (*(QWidgetRepaintManager **)(lVar1 + 8) != (QWidgetRepaintManager *)0x0)))) {
      QWidgetRepaintManager::markDirty<QRect>
                (*(QWidgetRepaintManager **)(lVar1 + 8),&local_20,this_00,UpdateNow,BufferValid);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::repaint(T r)
{
    Q_Q(QWidget);

    if (!q->isVisible() || !q->updatesEnabled() || r.isEmpty())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(r, q, QWidgetRepaintManager::UpdateNow);
}